

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_match.cpp
# Opt level: O0

string * check_type(string *__return_storage_ptr__,string *opt)

{
  bool bVar1;
  ostream *poVar2;
  ValidationError *this;
  string local_1e0;
  ostringstream local_1b0 [8];
  ostringstream msg;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_30;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_28;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_20;
  string *local_18;
  string *opt_local;
  
  local_18 = opt;
  opt_local = __return_storage_ptr__;
  local_28._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       CLI::std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin(&CSD_TYPES_abi_cxx11_);
  local_30 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CLI::std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end(&CSD_TYPES_abi_cxx11_);
  local_20 = std::
             find<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::__cxx11::string>
                       (local_28,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  )local_30,local_18);
  local_38._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       CLI::std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::end(&CSD_TYPES_abi_cxx11_);
  bVar1 = __gnu_cxx::operator==(&local_20,&local_38);
  if (!bVar1) {
    std::__cxx11::string::string((string *)__return_storage_ptr__);
    return __return_storage_ptr__;
  }
  std::__cxx11::ostringstream::ostringstream(local_1b0);
  poVar2 = std::operator<<((ostream *)local_1b0,(string *)local_18);
  std::operator<<(poVar2," is not a valid type.");
  this = (ValidationError *)__cxa_allocate_exception(0x38);
  std::__cxx11::ostringstream::str();
  CLI::ValidationError::ValidationError(this,&local_1e0);
  __cxa_throw(this,&CLI::ValidationError::typeinfo,CLI::ValidationError::~ValidationError);
}

Assistant:

std::string
check_type(const std::string& opt)
{
    if (std::find(CSD_TYPES.begin(), CSD_TYPES.end(), opt) == CSD_TYPES.end()) {
        std::ostringstream msg{};
        msg << opt << " is not a valid type.";
        throw CLI::ValidationError(msg.str());
    }

    return std::string();
}